

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O3

void nhdp_db_neighbor_remove(nhdp_neighbor *neigh)

{
  undefined8 uVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  ulong uVar5;
  netaddr_str nbuf;
  
  uVar5 = (ulong)LOG_NHDP;
  if (((&log_global_mask)[uVar5] & 1) != 0) {
    uVar1 = netaddr_to_prefixstring(&nbuf,neigh,0);
    oonf_log(1,uVar5,"src/nhdp/nhdp/nhdp_db.c",0xf4,0,0,"Remove Neighbor: 0x%0zx (%s)",neigh,uVar1);
  }
  oonf_class_event(&_neigh_info,neigh,2);
  if (neigh->dualstack_partner != (nhdp_neighbor *)0x0) {
    neigh->dualstack_partner->dualstack_partner = (nhdp_neighbor *)0x0;
    neigh->dualstack_partner = (nhdp_neighbor *)0x0;
  }
  plVar3 = (neigh->_links).next;
  plVar2 = plVar3->prev;
  while (plVar2 != (neigh->_links).prev) {
    plVar4 = plVar3->next;
    nhdp_db_link_remove((nhdp_link *)&plVar3[-0x20].prev);
    plVar3 = plVar4;
    plVar2 = plVar4->prev;
  }
  plVar3 = (neigh->_neigh_addresses).list_head.next;
  plVar2 = plVar3->prev;
  while (plVar2 != (neigh->_neigh_addresses).list_head.prev) {
    plVar4 = plVar3->next;
    nhdp_db_neighbor_addr_remove((nhdp_naddr *)&plVar3[-9].prev);
    plVar3 = plVar4;
    plVar2 = plVar4->prev;
  }
  if ((neigh->originator)._type != '\0') {
    avl_remove(&_neigh_originator_tree,&neigh->_originator_node);
  }
  plVar3 = nhdp_domain_get_list();
  do {
    plVar3 = plVar3->next;
    plVar2 = plVar3->prev;
    plVar4 = nhdp_domain_get_list();
    if (plVar2 == plVar4->prev) goto LAB_001050be;
  } while (neigh->_domaindata[*(int *)((long)&plVar3[-0x27].next + 4)].neigh_is_mpr != true);
  nhdp_domain_delayed_mpr_recalculation((nhdp_domain *)0x0,neigh);
LAB_001050be:
  plVar3 = (neigh->_global_node).next;
  plVar2 = (neigh->_global_node).prev;
  plVar2->next = plVar3;
  plVar3->prev = plVar2;
  (neigh->_global_node).next = (list_entity *)0x0;
  (neigh->_global_node).prev = (list_entity *)0x0;
  oonf_class_free(&_neigh_info,neigh);
  return;
}

Assistant:

void
nhdp_db_neighbor_remove(struct nhdp_neighbor *neigh) {
  struct nhdp_neighbor_domaindata *neighdata;
  struct nhdp_naddr *naddr, *na_it;
  struct nhdp_link *lnk, *l_it;
  struct nhdp_domain *domain;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif
  bool was_mpr;

  OONF_DEBUG(LOG_NHDP, "Remove Neighbor: 0x%0zx (%s)", (size_t)neigh, netaddr_to_string(&nbuf, &neigh->originator));

  /* trigger event */
  oonf_class_event(&_neigh_info, neigh, OONF_OBJECT_REMOVED);

  /* disconnect from other IP version */
  nhdp_db_neigbor_disconnect_dualstack(neigh);

  /* remove all links */
  list_for_each_element_safe(&neigh->_links, lnk, _neigh_node, l_it) {
    nhdp_db_link_remove(lnk);
  }

  /* remove all neighbor addresses */
  avl_for_each_element_safe(&neigh->_neigh_addresses, naddr, _neigh_node, na_it) {
    nhdp_db_neighbor_addr_remove(naddr);
  }

  /* remove from originator tree if necessary */
  if (netaddr_get_address_family(&neigh->originator) != AF_UNSPEC) {
    avl_remove(&_neigh_originator_tree, &neigh->_originator_node);
  }

  /* check if neighbor was a MPR */
  was_mpr = false;
  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    neighdata = nhdp_domain_get_neighbordata(domain, neigh);
    if (neighdata->neigh_is_mpr) {
      was_mpr = true;
      break;
    }
  }

  if (was_mpr) {
    /* all domains might have changed */
    nhdp_domain_delayed_mpr_recalculation(NULL, neigh);
  }

  /* remove from global list and free memory */
  list_remove(&neigh->_global_node);
  oonf_class_free(&_neigh_info, neigh);
}